

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O1

uint64_t do_ats_write(CPUARMState_conflict *env,uint64_t value,MMUAccessType access_type,
                     ARMMMUIdx mmu_idx)

{
  _Bool _Var1;
  _Bool _Var2;
  bool bVar3;
  uint32_t uVar4;
  uint uVar5;
  ulong uVar6;
  int *piVar7;
  ulong uVar8;
  uint uVar9;
  int line;
  uint32_t target_el;
  int *piVar10;
  uint32_t uVar11;
  bool bVar12;
  ARMMMUFaultInfo_conflict1 fi;
  MemTxAttrs attrs;
  hwaddr phys_addr;
  ARMCacheAttrs cacheattrs;
  target_ulong page_size;
  int prot;
  
  attrs = (MemTxAttrs)0x0;
  fi.level = 0;
  fi.domain = 0;
  fi.stage2 = false;
  fi.s1ptw = false;
  fi.ea = false;
  fi._27_5_ = 0;
  fi.type = ARMFault_None;
  fi._4_4_ = 0;
  fi.s2addr = 0;
  cacheattrs = (ARMCacheAttrs)0x0;
  _Var2 = get_phys_addr_aarch64
                    (env,value,access_type,mmu_idx,&phys_addr,&attrs,&prot,&page_size,&fi,
                     &cacheattrs);
  if (_Var2) {
    uVar8 = env->features;
    uVar5 = (uint)uVar8;
    if ((uVar5 >> 9 & 1) == 0) {
      if (env->aarch64 == 0) {
        uVar9 = env->uncached_cpsr & 0x1f;
        if (uVar9 == 0x10) {
          uVar11 = 0;
        }
        else if (uVar9 == 0x16) {
          uVar11 = 3;
        }
        else if (uVar9 == 0x1a) {
          uVar11 = 2;
        }
        else {
          if ((uVar8 >> 0x21 & 1) != 0) {
            bVar3 = uVar9 == 0x16;
            if (!bVar3) {
              bVar3 = ((env->cp15).scr_el3 & 1) == 0;
            }
            if (((uVar5 >> 0x1c & 1) == 0) && (uVar11 = 3, bVar3)) goto LAB_006207da;
          }
          uVar11 = 1;
        }
      }
      else {
        uVar11 = env->pstate >> 2 & 3;
      }
    }
    else {
      uVar11 = 1;
      if ((env->v7m).exception == 0) {
        uVar11 = ~(env->v7m).control[(env->v7m).secure] & 1;
      }
    }
LAB_006207da:
    _Var1 = fi.s1ptw;
    if ((fi.s1ptw == true) && (uVar11 == 1)) {
      if ((uVar8 >> 0x21 & 1) == 0) {
        if (2 < mmu_idx - ARMMMUIdx_Stage1_E0) goto LAB_006208ab;
      }
      else {
        if (env->aarch64 == 0) {
          bVar3 = (env->uncached_cpsr & 0x1f) == 0x16;
        }
        else {
          bVar3 = (~env->pstate & 0xc) == 0;
        }
        if (!bVar3) {
          bVar3 = ((env->cp15).scr_el3 & 1) == 0;
        }
        if ((mmu_idx + ~ARMMMUIdx_Stage1_E1_PAN < 0xfffffffd) || (bVar3)) goto LAB_006208ab;
      }
      if ((fi.type == ARMFault_SyncExternalOnWalk) && (((env->cp15).scr_el3 & 8) != 0)) {
        bVar3 = true;
        piVar10 = (int *)0x3;
      }
      else {
        (env->cp15).hpfar_el2 = fi.s2addr >> 8 & 0x7fffffffffff0;
        bVar3 = true;
        piVar10 = (int *)&DAT_00000002;
      }
    }
    else {
LAB_006208ab:
      if (fi.type == ARMFault_SyncExternalOnWalk) {
        if (fi.stage2 == true) {
          bVar3 = true;
          piVar10 = (int *)(ulong)(uVar11 == 3 | 2);
        }
        else {
          if ((uVar5 >> 9 & 1) == 0) {
            if (env->aarch64 == 0) {
              uVar9 = env->uncached_cpsr & 0x1f;
              if (uVar9 == 0x10) {
                uVar9 = 0;
              }
              else if (uVar9 == 0x16) {
                uVar9 = 3;
              }
              else if (uVar9 == 0x1a) {
                uVar9 = 2;
              }
              else {
                if ((uVar8 & 0x200000000) != 0) {
                  bVar3 = uVar9 == 0x16;
                  if (!bVar3) {
                    bVar3 = ((env->cp15).scr_el3 & 1) == 0;
                  }
                  if (((uVar5 >> 0x1c & 1) == 0) && (uVar9 = 3, bVar3)) goto LAB_006209fb;
                }
                uVar9 = 1;
              }
            }
            else {
              uVar9 = env->pstate >> 2 & 3;
            }
          }
          else {
            uVar9 = 1;
            if ((env->v7m).exception == 0) {
              uVar9 = ~(env->v7m).control[(env->v7m).secure] & 1;
            }
          }
LAB_006209fb:
          piVar10 = (int *)&DAT_00000001;
          if (uVar9 != 0) {
            if ((uVar5 >> 9 & 1) == 0) {
              if (env->aarch64 == 0) {
                uVar9 = env->uncached_cpsr & 0x1f;
                if (uVar9 == 0x10) {
                  piVar10 = (int *)0x0;
                }
                else if (uVar9 == 0x16) {
                  piVar10 = (int *)0x3;
                }
                else if (uVar9 == 0x1a) {
                  piVar10 = (int *)&DAT_00000002;
                }
                else {
                  if ((uVar8 & 0x200000000) != 0) {
                    bVar3 = uVar9 == 0x16;
                    if (!bVar3) {
                      bVar3 = ((env->cp15).scr_el3 & 1) == 0;
                    }
                    if (((uVar5 >> 0x1c & 1) == 0) && (piVar10 = (int *)0x3, bVar3))
                    goto LAB_00620a54;
                  }
                  piVar10 = (int *)&DAT_00000001;
                }
              }
              else {
                piVar10 = (int *)(ulong)(env->pstate >> 2 & 3);
              }
            }
            else if ((env->v7m).exception == 0) {
              piVar10 = (int *)(ulong)(~(env->v7m).control[(env->v7m).secure] & 1);
            }
          }
LAB_00620a54:
          bVar3 = true;
          if ((uVar8 & 0x200000000) != 0) {
            if (env->aarch64 == 0) {
              bVar12 = (env->uncached_cpsr & 0x1f) == 0x16;
            }
            else {
              bVar12 = (~env->pstate & 0xc) == 0;
            }
            if (!bVar12) {
              bVar12 = ((env->cp15).scr_el3 & 1) == 0;
            }
            if (bVar12) {
              piVar7 = (int *)0x3;
              if ((int)piVar10 != 1) {
                piVar7 = piVar10;
              }
              if ((uVar8 & 0x10000000) == 0) {
                piVar10 = piVar7;
              }
            }
          }
        }
      }
      else {
        bVar3 = false;
        piVar10 = &prot;
      }
    }
    if (bVar3) {
      target_el = (uint32_t)piVar10;
      if (((target_el == 2) || (_Var2 = arm_el_is_aa64(env,target_el), _Var2)) ||
         (_Var2 = arm_s1_regime_using_lpae_format_aarch64(env,mmu_idx), _Var2)) {
        uVar4 = arm_fi_to_lfsc(&fi);
        uVar5 = uVar4 & 0x3f;
      }
      else {
        uVar4 = arm_fi_to_sfsc(&fi);
        uVar5 = 0x3f;
      }
      (env->exception).vaddress = value;
      (env->exception).fsr = uVar4;
      raise_exception_aarch64
                (env,4,uVar5 + ((uint)_Var1 << 7 |
                               (uint)fi.ea << 9 | (uint)(uVar11 == target_el) << 0x1a) + 0x92000140,
                 target_el);
    }
  }
  if (env->aarch64 == 0) {
    if ((env->features & 0x4000000) != 0) {
      bVar3 = arm_s1_regime_using_lpae_format_aarch64(env,mmu_idx);
      if ((env->features >> 0x20 & 1) != 0) {
        if ((mmu_idx < ARMMMUIdx_E2) && ((0xd0000U >> (mmu_idx & 0x1f) & 1) != 0)) {
          bVar3 = bVar3 || ((env->cp15).hcr_el2 & 0x1001) != 0;
        }
        else {
          if (((uint)env->features >> 9 & 1) == 0) {
            if (env->aarch64 == 0) {
              bVar12 = (env->uncached_cpsr & 0x1f) == 0x1a;
            }
            else {
              bVar12 = (env->pstate & 0xc) == 8;
            }
          }
          else {
            bVar12 = false;
          }
          bVar3 = (bool)(bVar3 | bVar12);
        }
      }
      if (bVar3 != false) goto LAB_006208e2;
    }
    if (!_Var2) {
      if ((page_size == 0x1000000) && ((env->features & 0x20) != 0)) {
        uVar8 = (ulong)phys_addr._3_1_ << 0x18 | 2;
      }
      else {
        uVar8 = (ulong)((uint)phys_addr & 0xfffff000);
      }
      if (((uint)attrs & 2) == 0) {
        return uVar8 | 0x200;
      }
      return uVar8;
    }
    uVar8 = fi._0_8_ & 0xffffffff;
    switch(uVar8) {
    case 0:
      goto switchD_00620cab_caseD_0;
    case 1:
      uVar5 = (uint)(fi.level != 1) * 3 + 3;
      break;
    case 2:
      uVar5 = 1;
      break;
    case 3:
      uVar5 = 0;
      break;
    case 4:
      uVar5 = (uint)(fi.level != 1) * 2 + 9;
      break;
    case 5:
      uVar5 = (uint)(fi.level != 1) * 2 + 0xd;
      break;
    case 6:
      uVar5 = (uint)(fi.level != 1) * 2 + 5;
      break;
    default:
      line = 0x2a3;
      goto LAB_00620f2a;
    case 8:
      uVar5 = (uint)fi.ea << 0xc | 8;
      break;
    case 9:
      uVar5 = (uint)fi.ea * 0x1000 + (uint)(fi.level != 1) * 2 + 0xc;
      break;
    case 10:
      uVar5 = 0x409;
      break;
    case 0xb:
      uVar5 = (uint)(fi.level != 1) * 2 + 0x40c;
      break;
    case 0xc:
      uVar5 = 0x408;
      break;
    case 0xd:
      uVar5 = (uint)fi.ea << 0xc | 0x406;
      break;
    case 0xe:
      uVar5 = 2;
      break;
    case 0xf:
      uVar5 = 0x400;
      break;
    case 0x10:
      uVar5 = 0x404;
      break;
    case 0x11:
      uVar5 = 0x405;
      break;
    case 0x12:
      uVar5 = 4;
      break;
    case 0x13:
      uVar5 = 0xf;
      break;
    case 0x14:
      uVar5 = 0xe;
    }
    uVar8 = (ulong)(fi.domain << 4 | uVar5);
switchD_00620cab_caseD_0:
    return (ulong)(((uint)(uVar8 >> 6) & 0x40 | (uint)(uVar8 >> 5) & 0x20) + ((uint)uVar8 & 0xf) * 2
                  + 1);
  }
LAB_006208e2:
  if (!_Var2) {
    return (ulong)((ushort)cacheattrs._0_2_ >> 1 & 0x180) |
           (ulong)(ushort)cacheattrs._0_2_ << 0x38 |
           (ulong)(((uint)attrs & 2) == 0) << 9 |
           CONCAT44(phys_addr._4_4_,(uint)phys_addr) & 0xfffffffffffff000 | 0x800;
  }
  switch(fi._0_8_ & 0xffffffff) {
  case 0:
    uVar8 = 0x801;
    goto LAB_00620b56;
  case 1:
    uVar5 = fi.level & 3U | 8;
    break;
  case 2:
    uVar5 = 0x21;
    break;
  default:
    line = 0x2e8;
LAB_00620f2a:
    g_assertion_message_expr
              ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/internals.h"
               ,line,(char *)0x0);
  case 5:
    uVar5 = fi.level & 3U | 0xc;
    break;
  case 6:
    uVar5 = fi.level & 3U | 4;
    break;
  case 7:
    uVar5 = fi.level & 3;
    break;
  case 8:
    uVar5 = 0x10;
    break;
  case 9:
    uVar5 = fi.level & 3U | 0x14;
    break;
  case 10:
    uVar5 = 0x18;
    break;
  case 0xb:
    uVar5 = fi.level & 3U | 0x1c;
    break;
  case 0xc:
    uVar5 = 0x19;
    break;
  case 0xd:
    uVar5 = 0x11;
    break;
  case 0xe:
    uVar5 = 0x22;
    break;
  case 0xf:
    uVar5 = 0x30;
    break;
  case 0x10:
    uVar5 = 0x34;
    break;
  case 0x11:
    uVar5 = 0x35;
  }
  uVar8 = (ulong)(uVar5 * 2 + 0x801);
LAB_00620b56:
  uVar6 = uVar8 | 0x200;
  if (fi.stage2 == false) {
    uVar6 = uVar8;
  }
  uVar8 = uVar6 | 0x100;
  if (fi.s1ptw == false) {
    uVar8 = uVar6;
  }
  return uVar8;
}

Assistant:

static uint64_t do_ats_write(CPUARMState *env, uint64_t value,
                             MMUAccessType access_type, ARMMMUIdx mmu_idx)
{
    hwaddr phys_addr;
    target_ulong page_size;
    int prot;
    bool ret;
    uint64_t par64;
    bool format64 = false;
    MemTxAttrs attrs = { 0 };
    ARMMMUFaultInfo fi = { 0 };
    ARMCacheAttrs cacheattrs = { 0 };

    ret = get_phys_addr(env, value, access_type, mmu_idx, &phys_addr, &attrs,
                        &prot, &page_size, &fi, &cacheattrs);

    if (ret) {
        /*
         * Some kinds of translation fault must cause exceptions rather
         * than being reported in the PAR.
         */
        int current_el = arm_current_el(env);
        int target_el;
        uint32_t syn, fsr, fsc;
        bool take_exc = false;

        if (fi.s1ptw && current_el == 1 && !arm_is_secure(env)
            && arm_mmu_idx_is_stage1_of_2(mmu_idx)) {
            /*
             * Synchronous stage 2 fault on an access made as part of the
             * translation table walk for AT S1E0* or AT S1E1* insn
             * executed from NS EL1. If this is a synchronous external abort
             * and SCR_EL3.EA == 1, then we take a synchronous external abort
             * to EL3. Otherwise the fault is taken as an exception to EL2,
             * and HPFAR_EL2 holds the faulting IPA.
             */
            if (fi.type == ARMFault_SyncExternalOnWalk &&
                (env->cp15.scr_el3 & SCR_EA)) {
                target_el = 3;
            } else {
                env->cp15.hpfar_el2 = extract64(fi.s2addr, 12, 47) << 4;
                target_el = 2;
            }
            take_exc = true;
        } else if (fi.type == ARMFault_SyncExternalOnWalk) {
            /*
             * Synchronous external aborts during a translation table walk
             * are taken as Data Abort exceptions.
             */
            if (fi.stage2) {
                if (current_el == 3) {
                    target_el = 3;
                } else {
                    target_el = 2;
                }
            } else {
                target_el = exception_target_el(env);
            }
            take_exc = true;
        }

        if (take_exc) {
            /* Construct FSR and FSC using same logic as arm_deliver_fault() */
            if (target_el == 2 || arm_el_is_aa64(env, target_el) ||
                arm_s1_regime_using_lpae_format(env, mmu_idx)) {
                fsr = arm_fi_to_lfsc(&fi);
                fsc = extract32(fsr, 0, 6);
            } else {
                fsr = arm_fi_to_sfsc(&fi);
                fsc = 0x3f;
            }
            /*
             * Report exception with ESR indicating a fault due to a
             * translation table walk for a cache maintenance instruction.
             */
            syn = syn_data_abort_no_iss(current_el == target_el,
                                        fi.ea, 1, fi.s1ptw, 1, fsc);
            env->exception.vaddress = value;
            env->exception.fsr = fsr;
            raise_exception(env, EXCP_DATA_ABORT, syn, target_el);
        }
    }

    if (is_a64(env)) {
        format64 = true;
    } else if (arm_feature(env, ARM_FEATURE_LPAE)) {
        /*
         * ATS1Cxx:
         * * TTBCR.EAE determines whether the result is returned using the
         *   32-bit or the 64-bit PAR format
         * * Instructions executed in Hyp mode always use the 64bit format
         *
         * ATS1S2NSOxx uses the 64bit format if any of the following is true:
         * * The Non-secure TTBCR.EAE bit is set to 1
         * * The implementation includes EL2, and the value of HCR.VM is 1
         *
         * (Note that HCR.DC makes HCR.VM behave as if it is 1.)
         *
         * ATS1Hx always uses the 64bit format.
         */
        format64 = arm_s1_regime_using_lpae_format(env, mmu_idx);

        if (arm_feature(env, ARM_FEATURE_EL2)) {
            if (mmu_idx == ARMMMUIdx_E10_0 ||
                mmu_idx == ARMMMUIdx_E10_1 ||
                mmu_idx == ARMMMUIdx_E10_1_PAN) {
                format64 |= env->cp15.hcr_el2 & (HCR_VM | HCR_DC);
            } else {
                format64 |= arm_current_el(env) == 2;
            }
        }
    }

    if (format64) {
        /* Create a 64-bit PAR */
        par64 = (1 << 11); /* LPAE bit always set */
        if (!ret) {
            par64 |= phys_addr & ~0xfffULL;
            if (!attrs.secure) {
                par64 |= (1 << 9); /* NS */
            }
            par64 |= (uint64_t)cacheattrs.attrs << 56; /* ATTR */
            par64 |= cacheattrs.shareability << 7; /* SH */
        } else {
            uint32_t fsr = arm_fi_to_lfsc(&fi);

            par64 |= 1; /* F */
            par64 |= (fsr & 0x3f) << 1; /* FS */
            if (fi.stage2) {
                par64 |= (1 << 9); /* S */
            }
            if (fi.s1ptw) {
                par64 |= (1 << 8); /* PTW */
            }
        }
    } else {
        /* fsr is a DFSR/IFSR value for the short descriptor
         * translation table format (with WnR always clear).
         * Convert it to a 32-bit PAR.
         */
        if (!ret) {
            /* We do not set any attribute bits in the PAR */
            if (page_size == (1 << 24)
                && arm_feature(env, ARM_FEATURE_V7)) {
                par64 = (phys_addr & 0xff000000) | (1 << 1);
            } else {
                par64 = phys_addr & 0xfffff000;
            }
            if (!attrs.secure) {
                par64 |= (1 << 9); /* NS */
            }
        } else {
            uint32_t fsr = arm_fi_to_sfsc(&fi);

            par64 = ((fsr & (1 << 10)) >> 5) | ((fsr & (1 << 12)) >> 6) |
                    ((fsr & 0xf) << 1) | 1;
        }
    }
    return par64;
}